

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::DropFrameEncodeTestLarge_TestNoMisMatch_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::DropFrameEncodeTestLarge_TestNoMisMatch_Test>
           *this)

{
  Test *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,unsigned_int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x400);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01074940;
  this_00[1]._vptr_Test = (_func_int **)&PTR__CodecTestWith2Params_01074980;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
           ::GetParam();
  this_00[2]._vptr_Test =
       (_func_int **)
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[2].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[0x3c]._vptr_Test = (_func_int **)(this_00 + 0x3d);
  this_00[0x3c].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[0x3d]._vptr_Test = 0;
  this_00[0x3e]._vptr_Test = (_func_int **)0x0;
  this_00[0x3e].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[0x3f]._vptr_Test = (_func_int **)0x0;
  *(undefined4 *)((long)&this_00[3]._vptr_Test + 4) = 1;
  this_00->_vptr_Test = (_func_int **)&PTR__DropFrameEncodeTestLarge_01075558;
  this_00[1]._vptr_Test = (_func_int **)&PTR__DropFrameEncodeTestLarge_010755a0;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__DropFrameEncodeTestLarge_010755c0;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
           ::GetParam();
  *(uint *)&this_00[0x3f].gtest_flag_saver_._M_t.
            super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
            .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_unsigned_int>.
       super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
  this_00->_vptr_Test = (_func_int **)&PTR__DropFrameEncodeTestLarge_010753f8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__DropFrameEncodeTestLarge_TestNoMisMatch_Test_01075440;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__DropFrameEncodeTestLarge_TestNoMisMatch_Test_01075460;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }